

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O2

void blend_a64_vmask_bn_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,int h,blend_unit_fn blend)

{
  undefined4 in_register_0000000c;
  longlong lVar1;
  uint16_t *puVar2;
  undefined4 in_register_0000008c;
  longlong lVar3;
  long lVar4;
  uint16_t *puVar5;
  short sVar6;
  undefined8 extraout_XMM0_Qa;
  short sVar8;
  undefined1 auVar7 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar9 [16];
  __m128i alVar10;
  __m128i alVar11;
  
  lVar3 = CONCAT44(in_register_0000008c,src1_stride);
  lVar1 = CONCAT44(in_register_0000000c,src0_stride);
  lVar4 = 0;
  puVar2 = src1;
  puVar5 = src0;
  do {
    auVar7 = pshuflw(ZEXT116(mask[lVar4]),ZEXT116(mask[lVar4]),0);
    auVar9 = pmovsxbw(in_XMM1,0x4040404040404040);
    sVar6 = auVar7._0_2_;
    in_XMM1._0_2_ = auVar9._0_2_ - sVar6;
    sVar8 = auVar7._2_2_;
    in_XMM1._2_2_ = auVar9._2_2_ - sVar8;
    in_XMM1._4_2_ = auVar9._4_2_ - sVar6;
    in_XMM1._6_2_ = auVar9._6_2_ - sVar8;
    in_XMM1._8_2_ = auVar9._8_2_ - sVar6;
    in_XMM1._10_2_ = auVar9._10_2_ - sVar8;
    in_XMM1._12_2_ = auVar9._12_2_ - sVar6;
    in_XMM1._14_2_ = auVar9._14_2_ - sVar8;
    alVar10[1] = lVar1;
    alVar10[0] = (longlong)src0;
    alVar11[1] = lVar3;
    alVar11[0] = (longlong)puVar2;
    alVar10 = (*blend)(puVar5,src1,alVar10,alVar11);
    src0 = alVar10[1];
    *(undefined8 *)dst = extraout_XMM0_Qa;
    lVar4 = lVar4 + 1;
    src1 = src1 + src1_stride;
    puVar5 = puVar5 + src0_stride;
    dst = dst + dst_stride;
  } while (h != (int)lVar4);
  return;
}

Assistant:

static inline void blend_a64_vmask_bn_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, int h, blend_unit_fn blend) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    const __m128i v_m0_w = _mm_set1_epi16(*mask);
    const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

    const __m128i v_res_w = blend(src0, src1, v_m0_w, v_m1_w);

    xx_storel_64(dst, v_res_w);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 1;
  } while (--h);
}